

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O2

void __thiscall
Assimp::glTF2Exporter::GetMatTexProp
          (glTF2Exporter *this,aiMaterial *mat,float *prop,char *propName,aiTextureType tt,uint slot
          )

{
  string textureKey;
  allocator local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&local_88,"$tex.file",&local_89);
  std::operator+(&local_68,&local_88,".");
  std::operator+(&local_48,&local_68,propName);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  aiGetMaterialFloat(mat,local_48._M_dataplus._M_p,tt,slot,prop);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void glTF2Exporter::GetMatTexProp(const aiMaterial* mat, float& prop, const char* propName, aiTextureType tt, unsigned int slot)
{
    std::string textureKey = std::string(_AI_MATKEY_TEXTURE_BASE) + "." + propName;

    mat->Get(textureKey.c_str(), tt, slot, prop);
}